

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O2

void aom_smooth_v_predictor_64x64_ssse3
               (uint8_t *dst,ptrdiff_t stride,uint8_t *top_row,uint8_t *left_column)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  unkuint9 Var41;
  undefined1 auVar42 [11];
  undefined1 auVar43 [15];
  unkuint9 Var44;
  undefined1 auVar45 [11];
  undefined1 auVar46 [15];
  unkuint9 Var47;
  undefined1 auVar48 [11];
  undefined1 auVar49 [15];
  unkuint9 Var50;
  undefined1 auVar51 [11];
  undefined1 auVar52 [15];
  unkuint9 Var53;
  undefined1 auVar54 [11];
  undefined1 auVar55 [15];
  undefined1 auVar56 [15];
  undefined1 auVar57 [15];
  undefined1 auVar58 [15];
  undefined1 auVar59 [15];
  undefined1 auVar60 [15];
  undefined1 auVar61 [15];
  undefined1 auVar62 [15];
  undefined1 auVar63 [15];
  undefined1 auVar64 [15];
  int left_offset;
  ulong uVar65;
  uint uVar66;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  short sVar69;
  ushort uVar70;
  ushort uVar71;
  ushort uVar72;
  short sVar73;
  ushort uVar74;
  ushort uVar75;
  ushort uVar76;
  ushort uVar77;
  short sVar78;
  ushort uVar79;
  ushort uVar80;
  short sVar81;
  ushort uVar82;
  ushort uVar83;
  short sVar84;
  ushort uVar85;
  ushort uVar86;
  short sVar87;
  ushort uVar88;
  ushort uVar89;
  short sVar90;
  ushort uVar91;
  ushort uVar92;
  short sVar93;
  ushort uVar94;
  ushort uVar95;
  ushort uVar96;
  short sVar97;
  ushort uVar98;
  short sVar99;
  ushort uVar100;
  short sVar101;
  ushort uVar102;
  short sVar103;
  ushort uVar104;
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  short sVar107;
  short sVar110;
  short sVar111;
  short sVar112;
  short sVar113;
  short sVar114;
  short sVar115;
  undefined1 auVar108 [16];
  short sVar116;
  undefined1 auVar109 [16];
  ushort uVar117;
  ushort uVar118;
  ushort uVar120;
  ushort uVar121;
  ushort uVar122;
  ushort uVar123;
  ushort uVar124;
  ushort uVar125;
  ushort uVar126;
  ushort uVar127;
  ushort uVar128;
  ushort uVar129;
  ushort uVar130;
  ushort uVar131;
  ushort uVar132;
  ushort uVar133;
  undefined1 auVar119 [16];
  short local_18;
  short sStack_16;
  
  auVar67 = pshuflw(ZEXT116(left_column[0x3f]),ZEXT116(left_column[0x3f]),0);
  auVar1 = *(undefined1 (*) [16])top_row;
  auVar2 = *(undefined1 (*) [16])(top_row + 0x10);
  auVar3 = *(undefined1 (*) [16])(top_row + 0x20);
  auVar4 = *(undefined1 (*) [16])(top_row + 0x30);
  auVar5[0xd] = 0;
  auVar5._0_13_ = auVar1._0_13_;
  auVar5[0xe] = auVar1[7];
  auVar10[0xc] = auVar1[6];
  auVar10._0_12_ = auVar1._0_12_;
  auVar10._13_2_ = auVar5._13_2_;
  auVar15[0xb] = 0;
  auVar15._0_11_ = auVar1._0_11_;
  auVar15._12_3_ = auVar10._12_3_;
  auVar20[10] = auVar1[5];
  auVar20._0_10_ = auVar1._0_10_;
  auVar20._11_4_ = auVar15._11_4_;
  auVar25[9] = 0;
  auVar25._0_9_ = auVar1._0_9_;
  auVar25._10_5_ = auVar20._10_5_;
  auVar30[8] = auVar1[4];
  auVar30._0_8_ = auVar1._0_8_;
  auVar30._9_6_ = auVar25._9_6_;
  auVar40._7_8_ = 0;
  auVar40._0_7_ = auVar30._8_7_;
  Var41 = CONCAT81(SUB158(auVar40 << 0x40,7),auVar1[3]);
  auVar55._9_6_ = 0;
  auVar55._0_9_ = Var41;
  auVar42._1_10_ = SUB1510(auVar55 << 0x30,5);
  auVar42[0] = auVar1[2];
  auVar56._11_4_ = 0;
  auVar56._0_11_ = auVar42;
  auVar35[2] = auVar1[1];
  auVar35._0_2_ = auVar1._0_2_;
  auVar35._3_12_ = SUB1512(auVar56 << 0x20,3);
  uVar96 = auVar1._0_2_ & 0xff;
  auVar6[0xd] = 0;
  auVar6._0_13_ = auVar2._0_13_;
  auVar6[0xe] = auVar2[7];
  auVar11[0xc] = auVar2[6];
  auVar11._0_12_ = auVar2._0_12_;
  auVar11._13_2_ = auVar6._13_2_;
  auVar16[0xb] = 0;
  auVar16._0_11_ = auVar2._0_11_;
  auVar16._12_3_ = auVar11._12_3_;
  auVar21[10] = auVar2[5];
  auVar21._0_10_ = auVar2._0_10_;
  auVar21._11_4_ = auVar16._11_4_;
  auVar26[9] = 0;
  auVar26._0_9_ = auVar2._0_9_;
  auVar26._10_5_ = auVar21._10_5_;
  auVar31[8] = auVar2[4];
  auVar31._0_8_ = auVar2._0_8_;
  auVar31._9_6_ = auVar26._9_6_;
  auVar43._7_8_ = 0;
  auVar43._0_7_ = auVar31._8_7_;
  Var44 = CONCAT81(SUB158(auVar43 << 0x40,7),auVar2[3]);
  auVar57._9_6_ = 0;
  auVar57._0_9_ = Var44;
  auVar45._1_10_ = SUB1510(auVar57 << 0x30,5);
  auVar45[0] = auVar2[2];
  auVar58._11_4_ = 0;
  auVar58._0_11_ = auVar45;
  auVar36[2] = auVar2[1];
  auVar36._0_2_ = auVar2._0_2_;
  auVar36._3_12_ = SUB1512(auVar58 << 0x20,3);
  uVar98 = auVar2._0_2_ & 0xff;
  auVar7[0xd] = 0;
  auVar7._0_13_ = auVar3._0_13_;
  auVar7[0xe] = auVar3[7];
  auVar12[0xc] = auVar3[6];
  auVar12._0_12_ = auVar3._0_12_;
  auVar12._13_2_ = auVar7._13_2_;
  auVar17[0xb] = 0;
  auVar17._0_11_ = auVar3._0_11_;
  auVar17._12_3_ = auVar12._12_3_;
  auVar22[10] = auVar3[5];
  auVar22._0_10_ = auVar3._0_10_;
  auVar22._11_4_ = auVar17._11_4_;
  auVar27[9] = 0;
  auVar27._0_9_ = auVar3._0_9_;
  auVar27._10_5_ = auVar22._10_5_;
  auVar32[8] = auVar3[4];
  auVar32._0_8_ = auVar3._0_8_;
  auVar32._9_6_ = auVar27._9_6_;
  auVar46._7_8_ = 0;
  auVar46._0_7_ = auVar32._8_7_;
  Var47 = CONCAT81(SUB158(auVar46 << 0x40,7),auVar3[3]);
  auVar59._9_6_ = 0;
  auVar59._0_9_ = Var47;
  auVar48._1_10_ = SUB1510(auVar59 << 0x30,5);
  auVar48[0] = auVar3[2];
  auVar60._11_4_ = 0;
  auVar60._0_11_ = auVar48;
  auVar37[2] = auVar3[1];
  auVar37._0_2_ = auVar3._0_2_;
  auVar37._3_12_ = SUB1512(auVar60 << 0x20,3);
  uVar100 = auVar3._0_2_ & 0xff;
  auVar8[0xd] = 0;
  auVar8._0_13_ = auVar4._0_13_;
  auVar8[0xe] = auVar4[7];
  auVar13[0xc] = auVar4[6];
  auVar13._0_12_ = auVar4._0_12_;
  auVar13._13_2_ = auVar8._13_2_;
  auVar18[0xb] = 0;
  auVar18._0_11_ = auVar4._0_11_;
  auVar18._12_3_ = auVar13._12_3_;
  auVar23[10] = auVar4[5];
  auVar23._0_10_ = auVar4._0_10_;
  auVar23._11_4_ = auVar18._11_4_;
  auVar28[9] = 0;
  auVar28._0_9_ = auVar4._0_9_;
  auVar28._10_5_ = auVar23._10_5_;
  auVar33[8] = auVar4[4];
  auVar33._0_8_ = auVar4._0_8_;
  auVar33._9_6_ = auVar28._9_6_;
  auVar49._7_8_ = 0;
  auVar49._0_7_ = auVar33._8_7_;
  Var50 = CONCAT81(SUB158(auVar49 << 0x40,7),auVar4[3]);
  auVar61._9_6_ = 0;
  auVar61._0_9_ = Var50;
  auVar51._1_10_ = SUB1510(auVar61 << 0x30,5);
  auVar51[0] = auVar4[2];
  auVar62._11_4_ = 0;
  auVar62._0_11_ = auVar51;
  auVar38[2] = auVar4[1];
  auVar38._0_2_ = auVar4._0_2_;
  auVar38._3_12_ = SUB1512(auVar62 << 0x20,3);
  uVar102 = auVar4._0_2_ & 0xff;
  for (uVar65 = 0; uVar65 < 0x40; uVar65 = uVar65 + 0x10) {
    auVar119 = *(undefined1 (*) [16])(smooth_weights + uVar65 + 0x3c);
    auVar9[0xd] = 0;
    auVar9._0_13_ = auVar119._0_13_;
    auVar9[0xe] = auVar119[7];
    auVar14[0xc] = auVar119[6];
    auVar14._0_12_ = auVar119._0_12_;
    auVar14._13_2_ = auVar9._13_2_;
    auVar19[0xb] = 0;
    auVar19._0_11_ = auVar119._0_11_;
    auVar19._12_3_ = auVar14._12_3_;
    auVar24[10] = auVar119[5];
    auVar24._0_10_ = auVar119._0_10_;
    auVar24._11_4_ = auVar19._11_4_;
    auVar29[9] = 0;
    auVar29._0_9_ = auVar119._0_9_;
    auVar29._10_5_ = auVar24._10_5_;
    auVar34[8] = auVar119[4];
    auVar34._0_8_ = auVar119._0_8_;
    auVar34._9_6_ = auVar29._9_6_;
    auVar52._7_8_ = 0;
    auVar52._0_7_ = auVar34._8_7_;
    Var53 = CONCAT81(SUB158(auVar52 << 0x40,7),auVar119[3]);
    auVar63._9_6_ = 0;
    auVar63._0_9_ = Var53;
    auVar54._1_10_ = SUB1510(auVar63 << 0x30,5);
    auVar54[0] = auVar119[2];
    auVar64._11_4_ = 0;
    auVar64._0_11_ = auVar54;
    auVar39[2] = auVar119[1];
    auVar39._0_2_ = auVar119._0_2_;
    auVar39._3_12_ = SUB1512(auVar64 << 0x20,3);
    auVar105._0_2_ = auVar119._0_2_ & 0xff;
    auVar105._2_13_ = auVar39._2_13_;
    auVar105[0xf] = 0;
    auVar68._0_2_ = CONCAT11(0,auVar119[8]);
    auVar68[2] = auVar119[9];
    auVar68[3] = 0;
    auVar68[4] = auVar119[10];
    auVar68[5] = 0;
    auVar68[6] = auVar119[0xb];
    auVar68[7] = 0;
    auVar68[8] = auVar119[0xc];
    auVar68[9] = 0;
    auVar68[10] = auVar119[0xd];
    auVar68[0xb] = 0;
    auVar68[0xc] = auVar119[0xe];
    auVar68[0xd] = 0;
    auVar68[0xe] = auVar119[0xf];
    auVar68[0xf] = 0;
    local_18 = auVar67._0_2_;
    sStack_16 = auVar67._2_2_;
    auVar109._0_2_ = (0x100 - auVar105._0_2_) * local_18;
    auVar109._2_2_ = (0x100 - auVar39._2_2_) * sStack_16;
    auVar109._4_2_ = (0x100 - auVar54._0_2_) * local_18;
    auVar109._6_2_ = (0x100 - (short)Var53) * sStack_16;
    auVar109._8_2_ = (0x100 - auVar34._8_2_) * local_18;
    auVar109._10_2_ = (0x100 - auVar24._10_2_) * sStack_16;
    auVar109._12_2_ = (0x100 - auVar14._12_2_) * local_18;
    auVar109._14_2_ = (0x100 - (auVar9._13_2_ >> 8)) * sStack_16;
    uVar66 = 0x1000100;
    while( true ) {
      sVar97 = (short)Var41;
      uVar71 = auVar5._13_2_ >> 8;
      sVar99 = (short)Var44;
      uVar72 = auVar6._13_2_ >> 8;
      sVar101 = (short)Var47;
      uVar76 = auVar7._13_2_ >> 8;
      sVar103 = (short)Var50;
      uVar77 = auVar8._13_2_ >> 8;
      if (0xf0e0f0e < uVar66) break;
      auVar108._4_4_ = uVar66;
      auVar108._0_4_ = uVar66;
      auVar108._8_4_ = uVar66;
      auVar108._12_4_ = uVar66;
      auVar106 = pshufb(auVar105,auVar108);
      auVar108 = pshufb(auVar109,auVar108);
      sVar69 = auVar106._0_2_;
      sVar73 = auVar106._2_2_;
      sVar78 = auVar106._4_2_;
      sVar81 = auVar106._6_2_;
      sVar84 = auVar106._8_2_;
      sVar87 = auVar106._10_2_;
      sVar90 = auVar106._12_2_;
      sVar93 = auVar106._14_2_;
      sVar107 = auVar108._0_2_ + 0x80;
      sVar110 = auVar108._2_2_ + 0x80;
      sVar111 = auVar108._4_2_ + 0x80;
      sVar112 = auVar108._6_2_ + 0x80;
      sVar113 = auVar108._8_2_ + 0x80;
      sVar114 = auVar108._10_2_ + 0x80;
      sVar115 = auVar108._12_2_ + 0x80;
      sVar116 = auVar108._14_2_ + 0x80;
      uVar70 = sVar69 * uVar96 + sVar107;
      uVar74 = sVar73 * auVar35._2_2_ + sVar110;
      uVar79 = sVar78 * auVar42._0_2_ + sVar111;
      uVar82 = sVar81 * sVar97 + sVar112;
      uVar85 = sVar84 * auVar30._8_2_ + sVar113;
      uVar88 = sVar87 * auVar20._10_2_ + sVar114;
      uVar91 = sVar90 * auVar10._12_2_ + sVar115;
      uVar94 = sVar93 * uVar71 + sVar116;
      uVar71 = uVar70 >> 8;
      uVar75 = uVar74 >> 8;
      uVar80 = uVar79 >> 8;
      uVar83 = uVar82 >> 8;
      uVar86 = uVar85 >> 8;
      uVar89 = uVar88 >> 8;
      uVar92 = uVar91 >> 8;
      uVar95 = uVar94 >> 8;
      uVar117 = sVar69 * (ushort)auVar1[8] + sVar107;
      uVar120 = sVar73 * (ushort)auVar1[9] + sVar110;
      uVar122 = sVar78 * (ushort)auVar1[10] + sVar111;
      uVar124 = sVar81 * (ushort)auVar1[0xb] + sVar112;
      uVar126 = sVar84 * (ushort)auVar1[0xc] + sVar113;
      uVar128 = sVar87 * (ushort)auVar1[0xd] + sVar114;
      uVar130 = sVar90 * (ushort)auVar1[0xe] + sVar115;
      uVar132 = sVar93 * (ushort)auVar1[0xf] + sVar116;
      uVar118 = uVar117 >> 8;
      uVar121 = uVar120 >> 8;
      uVar123 = uVar122 >> 8;
      uVar125 = uVar124 >> 8;
      uVar127 = uVar126 >> 8;
      uVar129 = uVar128 >> 8;
      uVar131 = uVar130 >> 8;
      uVar133 = uVar132 >> 8;
      *dst = (uVar71 != 0) * (uVar71 < 0x100) * (char)(uVar70 >> 8) - (0xff < uVar71);
      dst[1] = (uVar75 != 0) * (uVar75 < 0x100) * (char)(uVar74 >> 8) - (0xff < uVar75);
      dst[2] = (uVar80 != 0) * (uVar80 < 0x100) * (char)(uVar79 >> 8) - (0xff < uVar80);
      dst[3] = (uVar83 != 0) * (uVar83 < 0x100) * (char)(uVar82 >> 8) - (0xff < uVar83);
      dst[4] = (uVar86 != 0) * (uVar86 < 0x100) * (char)(uVar85 >> 8) - (0xff < uVar86);
      dst[5] = (uVar89 != 0) * (uVar89 < 0x100) * (char)(uVar88 >> 8) - (0xff < uVar89);
      dst[6] = (uVar92 != 0) * (uVar92 < 0x100) * (char)(uVar91 >> 8) - (0xff < uVar92);
      dst[7] = (uVar95 != 0) * (uVar95 < 0x100) * (char)(uVar94 >> 8) - (0xff < uVar95);
      dst[8] = (uVar118 != 0) * (uVar118 < 0x100) * (char)(uVar117 >> 8) - (0xff < uVar118);
      dst[9] = (uVar121 != 0) * (uVar121 < 0x100) * (char)(uVar120 >> 8) - (0xff < uVar121);
      dst[10] = (uVar123 != 0) * (uVar123 < 0x100) * (char)(uVar122 >> 8) - (0xff < uVar123);
      dst[0xb] = (uVar125 != 0) * (uVar125 < 0x100) * (char)(uVar124 >> 8) - (0xff < uVar125);
      dst[0xc] = (uVar127 != 0) * (uVar127 < 0x100) * (char)(uVar126 >> 8) - (0xff < uVar127);
      dst[0xd] = (uVar129 != 0) * (uVar129 < 0x100) * (char)(uVar128 >> 8) - (0xff < uVar129);
      dst[0xe] = (uVar131 != 0) * (uVar131 < 0x100) * (char)(uVar130 >> 8) - (0xff < uVar131);
      dst[0xf] = (uVar133 != 0) * (uVar133 < 0x100) * (char)(uVar132 >> 8) - (0xff < uVar133);
      uVar71 = sVar69 * uVar98 + sVar107;
      uVar70 = sVar73 * auVar36._2_2_ + sVar110;
      uVar75 = sVar78 * auVar45._0_2_ + sVar111;
      uVar80 = sVar81 * sVar99 + sVar112;
      uVar83 = sVar84 * auVar31._8_2_ + sVar113;
      uVar86 = sVar87 * auVar21._10_2_ + sVar114;
      uVar89 = sVar90 * auVar11._12_2_ + sVar115;
      uVar92 = sVar93 * uVar72 + sVar116;
      uVar72 = uVar71 >> 8;
      uVar74 = uVar70 >> 8;
      uVar79 = uVar75 >> 8;
      uVar82 = uVar80 >> 8;
      uVar85 = uVar83 >> 8;
      uVar88 = uVar86 >> 8;
      uVar91 = uVar89 >> 8;
      uVar94 = uVar92 >> 8;
      uVar95 = sVar69 * (ushort)auVar2[8] + sVar107;
      uVar118 = sVar73 * (ushort)auVar2[9] + sVar110;
      uVar121 = sVar78 * (ushort)auVar2[10] + sVar111;
      uVar123 = sVar81 * (ushort)auVar2[0xb] + sVar112;
      uVar125 = sVar84 * (ushort)auVar2[0xc] + sVar113;
      uVar127 = sVar87 * (ushort)auVar2[0xd] + sVar114;
      uVar129 = sVar90 * (ushort)auVar2[0xe] + sVar115;
      uVar131 = sVar93 * (ushort)auVar2[0xf] + sVar116;
      uVar117 = uVar95 >> 8;
      uVar120 = uVar118 >> 8;
      uVar122 = uVar121 >> 8;
      uVar124 = uVar123 >> 8;
      uVar126 = uVar125 >> 8;
      uVar128 = uVar127 >> 8;
      uVar130 = uVar129 >> 8;
      uVar132 = uVar131 >> 8;
      dst[0x10] = (uVar72 != 0) * (uVar72 < 0x100) * (char)(uVar71 >> 8) - (0xff < uVar72);
      dst[0x11] = (uVar74 != 0) * (uVar74 < 0x100) * (char)(uVar70 >> 8) - (0xff < uVar74);
      dst[0x12] = (uVar79 != 0) * (uVar79 < 0x100) * (char)(uVar75 >> 8) - (0xff < uVar79);
      dst[0x13] = (uVar82 != 0) * (uVar82 < 0x100) * (char)(uVar80 >> 8) - (0xff < uVar82);
      dst[0x14] = (uVar85 != 0) * (uVar85 < 0x100) * (char)(uVar83 >> 8) - (0xff < uVar85);
      dst[0x15] = (uVar88 != 0) * (uVar88 < 0x100) * (char)(uVar86 >> 8) - (0xff < uVar88);
      dst[0x16] = (uVar91 != 0) * (uVar91 < 0x100) * (char)(uVar89 >> 8) - (0xff < uVar91);
      dst[0x17] = (uVar94 != 0) * (uVar94 < 0x100) * (char)(uVar92 >> 8) - (0xff < uVar94);
      dst[0x18] = (uVar117 != 0) * (uVar117 < 0x100) * (char)(uVar95 >> 8) - (0xff < uVar117);
      dst[0x19] = (uVar120 != 0) * (uVar120 < 0x100) * (char)(uVar118 >> 8) - (0xff < uVar120);
      dst[0x1a] = (uVar122 != 0) * (uVar122 < 0x100) * (char)(uVar121 >> 8) - (0xff < uVar122);
      dst[0x1b] = (uVar124 != 0) * (uVar124 < 0x100) * (char)(uVar123 >> 8) - (0xff < uVar124);
      dst[0x1c] = (uVar126 != 0) * (uVar126 < 0x100) * (char)(uVar125 >> 8) - (0xff < uVar126);
      dst[0x1d] = (uVar128 != 0) * (uVar128 < 0x100) * (char)(uVar127 >> 8) - (0xff < uVar128);
      dst[0x1e] = (uVar130 != 0) * (uVar130 < 0x100) * (char)(uVar129 >> 8) - (0xff < uVar130);
      dst[0x1f] = (uVar132 != 0) * (uVar132 < 0x100) * (char)(uVar131 >> 8) - (0xff < uVar132);
      uVar71 = sVar69 * uVar100 + sVar107;
      uVar70 = sVar73 * auVar37._2_2_ + sVar110;
      uVar74 = sVar78 * auVar48._0_2_ + sVar111;
      uVar79 = sVar81 * sVar101 + sVar112;
      uVar82 = sVar84 * auVar32._8_2_ + sVar113;
      uVar85 = sVar87 * auVar22._10_2_ + sVar114;
      uVar88 = sVar90 * auVar12._12_2_ + sVar115;
      uVar91 = sVar93 * uVar76 + sVar116;
      uVar72 = uVar71 >> 8;
      uVar76 = uVar70 >> 8;
      uVar75 = uVar74 >> 8;
      uVar80 = uVar79 >> 8;
      uVar83 = uVar82 >> 8;
      uVar86 = uVar85 >> 8;
      uVar89 = uVar88 >> 8;
      uVar92 = uVar91 >> 8;
      uVar94 = sVar69 * (ushort)auVar3[8] + sVar107;
      uVar117 = sVar73 * (ushort)auVar3[9] + sVar110;
      uVar120 = sVar78 * (ushort)auVar3[10] + sVar111;
      uVar122 = sVar81 * (ushort)auVar3[0xb] + sVar112;
      uVar124 = sVar84 * (ushort)auVar3[0xc] + sVar113;
      uVar126 = sVar87 * (ushort)auVar3[0xd] + sVar114;
      uVar128 = sVar90 * (ushort)auVar3[0xe] + sVar115;
      uVar130 = sVar93 * (ushort)auVar3[0xf] + sVar116;
      uVar95 = uVar94 >> 8;
      uVar118 = uVar117 >> 8;
      uVar121 = uVar120 >> 8;
      uVar123 = uVar122 >> 8;
      uVar125 = uVar124 >> 8;
      uVar127 = uVar126 >> 8;
      uVar129 = uVar128 >> 8;
      uVar131 = uVar130 >> 8;
      dst[0x20] = (uVar72 != 0) * (uVar72 < 0x100) * (char)(uVar71 >> 8) - (0xff < uVar72);
      dst[0x21] = (uVar76 != 0) * (uVar76 < 0x100) * (char)(uVar70 >> 8) - (0xff < uVar76);
      dst[0x22] = (uVar75 != 0) * (uVar75 < 0x100) * (char)(uVar74 >> 8) - (0xff < uVar75);
      dst[0x23] = (uVar80 != 0) * (uVar80 < 0x100) * (char)(uVar79 >> 8) - (0xff < uVar80);
      dst[0x24] = (uVar83 != 0) * (uVar83 < 0x100) * (char)(uVar82 >> 8) - (0xff < uVar83);
      dst[0x25] = (uVar86 != 0) * (uVar86 < 0x100) * (char)(uVar85 >> 8) - (0xff < uVar86);
      dst[0x26] = (uVar89 != 0) * (uVar89 < 0x100) * (char)(uVar88 >> 8) - (0xff < uVar89);
      dst[0x27] = (uVar92 != 0) * (uVar92 < 0x100) * (char)(uVar91 >> 8) - (0xff < uVar92);
      dst[0x28] = (uVar95 != 0) * (uVar95 < 0x100) * (char)(uVar94 >> 8) - (0xff < uVar95);
      dst[0x29] = (uVar118 != 0) * (uVar118 < 0x100) * (char)(uVar117 >> 8) - (0xff < uVar118);
      dst[0x2a] = (uVar121 != 0) * (uVar121 < 0x100) * (char)(uVar120 >> 8) - (0xff < uVar121);
      dst[0x2b] = (uVar123 != 0) * (uVar123 < 0x100) * (char)(uVar122 >> 8) - (0xff < uVar123);
      dst[0x2c] = (uVar125 != 0) * (uVar125 < 0x100) * (char)(uVar124 >> 8) - (0xff < uVar125);
      dst[0x2d] = (uVar127 != 0) * (uVar127 < 0x100) * (char)(uVar126 >> 8) - (0xff < uVar127);
      dst[0x2e] = (uVar129 != 0) * (uVar129 < 0x100) * (char)(uVar128 >> 8) - (0xff < uVar129);
      dst[0x2f] = (uVar131 != 0) * (uVar131 < 0x100) * (char)(uVar130 >> 8) - (0xff < uVar131);
      uVar71 = sVar69 * uVar102 + sVar107;
      uVar76 = sVar73 * auVar38._2_2_ + sVar110;
      uVar70 = sVar78 * auVar51._0_2_ + sVar111;
      uVar75 = sVar81 * sVar103 + sVar112;
      uVar80 = sVar84 * auVar33._8_2_ + sVar113;
      uVar83 = sVar87 * auVar23._10_2_ + sVar114;
      uVar86 = sVar90 * auVar13._12_2_ + sVar115;
      uVar89 = sVar93 * uVar77 + sVar116;
      uVar72 = uVar71 >> 8;
      uVar77 = uVar76 >> 8;
      uVar74 = uVar70 >> 8;
      uVar79 = uVar75 >> 8;
      uVar82 = uVar80 >> 8;
      uVar85 = uVar83 >> 8;
      uVar88 = uVar86 >> 8;
      uVar91 = uVar89 >> 8;
      uVar92 = sVar69 * (ushort)auVar4[8] + sVar107;
      uVar95 = sVar73 * (ushort)auVar4[9] + sVar110;
      uVar118 = sVar78 * (ushort)auVar4[10] + sVar111;
      uVar121 = sVar81 * (ushort)auVar4[0xb] + sVar112;
      uVar123 = sVar84 * (ushort)auVar4[0xc] + sVar113;
      uVar125 = sVar87 * (ushort)auVar4[0xd] + sVar114;
      uVar127 = sVar90 * (ushort)auVar4[0xe] + sVar115;
      uVar129 = sVar93 * (ushort)auVar4[0xf] + sVar116;
      uVar94 = uVar92 >> 8;
      uVar117 = uVar95 >> 8;
      uVar120 = uVar118 >> 8;
      uVar122 = uVar121 >> 8;
      uVar124 = uVar123 >> 8;
      uVar126 = uVar125 >> 8;
      uVar128 = uVar127 >> 8;
      uVar130 = uVar129 >> 8;
      dst[0x30] = (uVar72 != 0) * (uVar72 < 0x100) * (char)(uVar71 >> 8) - (0xff < uVar72);
      dst[0x31] = (uVar77 != 0) * (uVar77 < 0x100) * (char)(uVar76 >> 8) - (0xff < uVar77);
      dst[0x32] = (uVar74 != 0) * (uVar74 < 0x100) * (char)(uVar70 >> 8) - (0xff < uVar74);
      dst[0x33] = (uVar79 != 0) * (uVar79 < 0x100) * (char)(uVar75 >> 8) - (0xff < uVar79);
      dst[0x34] = (uVar82 != 0) * (uVar82 < 0x100) * (char)(uVar80 >> 8) - (0xff < uVar82);
      dst[0x35] = (uVar85 != 0) * (uVar85 < 0x100) * (char)(uVar83 >> 8) - (0xff < uVar85);
      dst[0x36] = (uVar88 != 0) * (uVar88 < 0x100) * (char)(uVar86 >> 8) - (0xff < uVar88);
      dst[0x37] = (uVar91 != 0) * (uVar91 < 0x100) * (char)(uVar89 >> 8) - (0xff < uVar91);
      dst[0x38] = (uVar94 != 0) * (uVar94 < 0x100) * (char)(uVar92 >> 8) - (0xff < uVar94);
      dst[0x39] = (uVar117 != 0) * (uVar117 < 0x100) * (char)(uVar95 >> 8) - (0xff < uVar117);
      dst[0x3a] = (uVar120 != 0) * (uVar120 < 0x100) * (char)(uVar118 >> 8) - (0xff < uVar120);
      dst[0x3b] = (uVar122 != 0) * (uVar122 < 0x100) * (char)(uVar121 >> 8) - (0xff < uVar122);
      dst[0x3c] = (uVar124 != 0) * (uVar124 < 0x100) * (char)(uVar123 >> 8) - (0xff < uVar124);
      dst[0x3d] = (uVar126 != 0) * (uVar126 < 0x100) * (char)(uVar125 >> 8) - (0xff < uVar126);
      dst[0x3e] = (uVar128 != 0) * (uVar128 < 0x100) * (char)(uVar127 >> 8) - (0xff < uVar128);
      dst[0x3f] = (uVar130 != 0) * (uVar130 < 0x100) * (char)(uVar129 >> 8) - (0xff < uVar130);
      dst = dst + stride;
      uVar66 = uVar66 + 0x2020202;
    }
    auVar106._0_2_ = (0x100 - auVar68._0_2_) * local_18;
    auVar106._2_2_ = (0x100 - (ushort)auVar119[9]) * sStack_16;
    auVar106._4_2_ = (0x100 - (ushort)auVar119[10]) * local_18;
    auVar106._6_2_ = (0x100 - (ushort)auVar119[0xb]) * sStack_16;
    auVar106._8_2_ = (0x100 - (ushort)auVar119[0xc]) * local_18;
    auVar106._10_2_ = (0x100 - (ushort)auVar119[0xd]) * sStack_16;
    auVar106._12_2_ = (0x100 - (ushort)auVar119[0xe]) * local_18;
    auVar106._14_2_ = (0x100 - (ushort)auVar119[0xf]) * sStack_16;
    for (uVar66 = 0x1000100; uVar66 < 0xf0e0f0f; uVar66 = uVar66 + 0x2020202) {
      auVar119._4_4_ = uVar66;
      auVar119._0_4_ = uVar66;
      auVar119._8_4_ = uVar66;
      auVar119._12_4_ = uVar66;
      auVar109 = pshufb(auVar68,auVar119);
      auVar119 = pshufb(auVar106,auVar119);
      sVar69 = auVar109._0_2_;
      sVar73 = auVar109._2_2_;
      sVar78 = auVar109._4_2_;
      sVar81 = auVar109._6_2_;
      sVar84 = auVar109._8_2_;
      sVar87 = auVar109._10_2_;
      sVar90 = auVar109._12_2_;
      sVar93 = auVar109._14_2_;
      sVar107 = auVar119._0_2_ + 0x80;
      sVar110 = auVar119._2_2_ + 0x80;
      sVar111 = auVar119._4_2_ + 0x80;
      sVar112 = auVar119._6_2_ + 0x80;
      sVar113 = auVar119._8_2_ + 0x80;
      sVar114 = auVar119._10_2_ + 0x80;
      sVar115 = auVar119._12_2_ + 0x80;
      sVar116 = auVar119._14_2_ + 0x80;
      uVar70 = sVar69 * uVar96 + sVar107;
      uVar75 = sVar73 * auVar35._2_2_ + sVar110;
      uVar80 = sVar78 * auVar42._0_2_ + sVar111;
      uVar83 = sVar81 * sVar97 + sVar112;
      uVar86 = sVar84 * auVar30._8_2_ + sVar113;
      uVar89 = sVar87 * auVar20._10_2_ + sVar114;
      uVar92 = sVar90 * auVar10._12_2_ + sVar115;
      uVar95 = sVar93 * uVar71 + sVar116;
      uVar74 = uVar70 >> 8;
      uVar79 = uVar75 >> 8;
      uVar82 = uVar80 >> 8;
      uVar85 = uVar83 >> 8;
      uVar88 = uVar86 >> 8;
      uVar91 = uVar89 >> 8;
      uVar94 = uVar92 >> 8;
      uVar117 = uVar95 >> 8;
      uVar118 = sVar69 * (ushort)auVar1[8] + sVar107;
      uVar121 = sVar73 * (ushort)auVar1[9] + sVar110;
      uVar123 = sVar78 * (ushort)auVar1[10] + sVar111;
      uVar125 = sVar81 * (ushort)auVar1[0xb] + sVar112;
      uVar127 = sVar84 * (ushort)auVar1[0xc] + sVar113;
      uVar129 = sVar87 * (ushort)auVar1[0xd] + sVar114;
      uVar131 = sVar90 * (ushort)auVar1[0xe] + sVar115;
      uVar133 = sVar93 * (ushort)auVar1[0xf] + sVar116;
      uVar120 = uVar118 >> 8;
      uVar122 = uVar121 >> 8;
      uVar124 = uVar123 >> 8;
      uVar126 = uVar125 >> 8;
      uVar128 = uVar127 >> 8;
      uVar130 = uVar129 >> 8;
      uVar132 = uVar131 >> 8;
      uVar104 = uVar133 >> 8;
      *dst = (uVar74 != 0) * (uVar74 < 0x100) * (char)(uVar70 >> 8) - (0xff < uVar74);
      dst[1] = (uVar79 != 0) * (uVar79 < 0x100) * (char)(uVar75 >> 8) - (0xff < uVar79);
      dst[2] = (uVar82 != 0) * (uVar82 < 0x100) * (char)(uVar80 >> 8) - (0xff < uVar82);
      dst[3] = (uVar85 != 0) * (uVar85 < 0x100) * (char)(uVar83 >> 8) - (0xff < uVar85);
      dst[4] = (uVar88 != 0) * (uVar88 < 0x100) * (char)(uVar86 >> 8) - (0xff < uVar88);
      dst[5] = (uVar91 != 0) * (uVar91 < 0x100) * (char)(uVar89 >> 8) - (0xff < uVar91);
      dst[6] = (uVar94 != 0) * (uVar94 < 0x100) * (char)(uVar92 >> 8) - (0xff < uVar94);
      dst[7] = (uVar117 != 0) * (uVar117 < 0x100) * (char)(uVar95 >> 8) - (0xff < uVar117);
      dst[8] = (uVar120 != 0) * (uVar120 < 0x100) * (char)(uVar118 >> 8) - (0xff < uVar120);
      dst[9] = (uVar122 != 0) * (uVar122 < 0x100) * (char)(uVar121 >> 8) - (0xff < uVar122);
      dst[10] = (uVar124 != 0) * (uVar124 < 0x100) * (char)(uVar123 >> 8) - (0xff < uVar124);
      dst[0xb] = (uVar126 != 0) * (uVar126 < 0x100) * (char)(uVar125 >> 8) - (0xff < uVar126);
      dst[0xc] = (uVar128 != 0) * (uVar128 < 0x100) * (char)(uVar127 >> 8) - (0xff < uVar128);
      dst[0xd] = (uVar130 != 0) * (uVar130 < 0x100) * (char)(uVar129 >> 8) - (0xff < uVar130);
      dst[0xe] = (uVar132 != 0) * (uVar132 < 0x100) * (char)(uVar131 >> 8) - (0xff < uVar132);
      dst[0xf] = (uVar104 != 0) * (uVar104 < 0x100) * (char)(uVar133 >> 8) - (0xff < uVar104);
      uVar70 = sVar69 * uVar98 + sVar107;
      uVar75 = sVar73 * auVar36._2_2_ + sVar110;
      uVar80 = sVar78 * auVar45._0_2_ + sVar111;
      uVar83 = sVar81 * sVar99 + sVar112;
      uVar86 = sVar84 * auVar31._8_2_ + sVar113;
      uVar89 = sVar87 * auVar21._10_2_ + sVar114;
      uVar92 = sVar90 * auVar11._12_2_ + sVar115;
      uVar95 = sVar93 * uVar72 + sVar116;
      uVar74 = uVar70 >> 8;
      uVar79 = uVar75 >> 8;
      uVar82 = uVar80 >> 8;
      uVar85 = uVar83 >> 8;
      uVar88 = uVar86 >> 8;
      uVar91 = uVar89 >> 8;
      uVar94 = uVar92 >> 8;
      uVar117 = uVar95 >> 8;
      uVar118 = sVar69 * (ushort)auVar2[8] + sVar107;
      uVar121 = sVar73 * (ushort)auVar2[9] + sVar110;
      uVar123 = sVar78 * (ushort)auVar2[10] + sVar111;
      uVar125 = sVar81 * (ushort)auVar2[0xb] + sVar112;
      uVar127 = sVar84 * (ushort)auVar2[0xc] + sVar113;
      uVar129 = sVar87 * (ushort)auVar2[0xd] + sVar114;
      uVar131 = sVar90 * (ushort)auVar2[0xe] + sVar115;
      uVar133 = sVar93 * (ushort)auVar2[0xf] + sVar116;
      uVar120 = uVar118 >> 8;
      uVar122 = uVar121 >> 8;
      uVar124 = uVar123 >> 8;
      uVar126 = uVar125 >> 8;
      uVar128 = uVar127 >> 8;
      uVar130 = uVar129 >> 8;
      uVar132 = uVar131 >> 8;
      uVar104 = uVar133 >> 8;
      dst[0x10] = (uVar74 != 0) * (uVar74 < 0x100) * (char)(uVar70 >> 8) - (0xff < uVar74);
      dst[0x11] = (uVar79 != 0) * (uVar79 < 0x100) * (char)(uVar75 >> 8) - (0xff < uVar79);
      dst[0x12] = (uVar82 != 0) * (uVar82 < 0x100) * (char)(uVar80 >> 8) - (0xff < uVar82);
      dst[0x13] = (uVar85 != 0) * (uVar85 < 0x100) * (char)(uVar83 >> 8) - (0xff < uVar85);
      dst[0x14] = (uVar88 != 0) * (uVar88 < 0x100) * (char)(uVar86 >> 8) - (0xff < uVar88);
      dst[0x15] = (uVar91 != 0) * (uVar91 < 0x100) * (char)(uVar89 >> 8) - (0xff < uVar91);
      dst[0x16] = (uVar94 != 0) * (uVar94 < 0x100) * (char)(uVar92 >> 8) - (0xff < uVar94);
      dst[0x17] = (uVar117 != 0) * (uVar117 < 0x100) * (char)(uVar95 >> 8) - (0xff < uVar117);
      dst[0x18] = (uVar120 != 0) * (uVar120 < 0x100) * (char)(uVar118 >> 8) - (0xff < uVar120);
      dst[0x19] = (uVar122 != 0) * (uVar122 < 0x100) * (char)(uVar121 >> 8) - (0xff < uVar122);
      dst[0x1a] = (uVar124 != 0) * (uVar124 < 0x100) * (char)(uVar123 >> 8) - (0xff < uVar124);
      dst[0x1b] = (uVar126 != 0) * (uVar126 < 0x100) * (char)(uVar125 >> 8) - (0xff < uVar126);
      dst[0x1c] = (uVar128 != 0) * (uVar128 < 0x100) * (char)(uVar127 >> 8) - (0xff < uVar128);
      dst[0x1d] = (uVar130 != 0) * (uVar130 < 0x100) * (char)(uVar129 >> 8) - (0xff < uVar130);
      dst[0x1e] = (uVar132 != 0) * (uVar132 < 0x100) * (char)(uVar131 >> 8) - (0xff < uVar132);
      dst[0x1f] = (uVar104 != 0) * (uVar104 < 0x100) * (char)(uVar133 >> 8) - (0xff < uVar104);
      uVar70 = sVar69 * uVar100 + sVar107;
      uVar75 = sVar73 * auVar37._2_2_ + sVar110;
      uVar80 = sVar78 * auVar48._0_2_ + sVar111;
      uVar83 = sVar81 * sVar101 + sVar112;
      uVar86 = sVar84 * auVar32._8_2_ + sVar113;
      uVar89 = sVar87 * auVar22._10_2_ + sVar114;
      uVar92 = sVar90 * auVar12._12_2_ + sVar115;
      uVar95 = sVar93 * uVar76 + sVar116;
      uVar74 = uVar70 >> 8;
      uVar79 = uVar75 >> 8;
      uVar82 = uVar80 >> 8;
      uVar85 = uVar83 >> 8;
      uVar88 = uVar86 >> 8;
      uVar91 = uVar89 >> 8;
      uVar94 = uVar92 >> 8;
      uVar117 = uVar95 >> 8;
      uVar118 = sVar69 * (ushort)auVar3[8] + sVar107;
      uVar121 = sVar73 * (ushort)auVar3[9] + sVar110;
      uVar123 = sVar78 * (ushort)auVar3[10] + sVar111;
      uVar125 = sVar81 * (ushort)auVar3[0xb] + sVar112;
      uVar127 = sVar84 * (ushort)auVar3[0xc] + sVar113;
      uVar129 = sVar87 * (ushort)auVar3[0xd] + sVar114;
      uVar131 = sVar90 * (ushort)auVar3[0xe] + sVar115;
      uVar133 = sVar93 * (ushort)auVar3[0xf] + sVar116;
      uVar120 = uVar118 >> 8;
      uVar122 = uVar121 >> 8;
      uVar124 = uVar123 >> 8;
      uVar126 = uVar125 >> 8;
      uVar128 = uVar127 >> 8;
      uVar130 = uVar129 >> 8;
      uVar132 = uVar131 >> 8;
      uVar104 = uVar133 >> 8;
      dst[0x20] = (uVar74 != 0) * (uVar74 < 0x100) * (char)(uVar70 >> 8) - (0xff < uVar74);
      dst[0x21] = (uVar79 != 0) * (uVar79 < 0x100) * (char)(uVar75 >> 8) - (0xff < uVar79);
      dst[0x22] = (uVar82 != 0) * (uVar82 < 0x100) * (char)(uVar80 >> 8) - (0xff < uVar82);
      dst[0x23] = (uVar85 != 0) * (uVar85 < 0x100) * (char)(uVar83 >> 8) - (0xff < uVar85);
      dst[0x24] = (uVar88 != 0) * (uVar88 < 0x100) * (char)(uVar86 >> 8) - (0xff < uVar88);
      dst[0x25] = (uVar91 != 0) * (uVar91 < 0x100) * (char)(uVar89 >> 8) - (0xff < uVar91);
      dst[0x26] = (uVar94 != 0) * (uVar94 < 0x100) * (char)(uVar92 >> 8) - (0xff < uVar94);
      dst[0x27] = (uVar117 != 0) * (uVar117 < 0x100) * (char)(uVar95 >> 8) - (0xff < uVar117);
      dst[0x28] = (uVar120 != 0) * (uVar120 < 0x100) * (char)(uVar118 >> 8) - (0xff < uVar120);
      dst[0x29] = (uVar122 != 0) * (uVar122 < 0x100) * (char)(uVar121 >> 8) - (0xff < uVar122);
      dst[0x2a] = (uVar124 != 0) * (uVar124 < 0x100) * (char)(uVar123 >> 8) - (0xff < uVar124);
      dst[0x2b] = (uVar126 != 0) * (uVar126 < 0x100) * (char)(uVar125 >> 8) - (0xff < uVar126);
      dst[0x2c] = (uVar128 != 0) * (uVar128 < 0x100) * (char)(uVar127 >> 8) - (0xff < uVar128);
      dst[0x2d] = (uVar130 != 0) * (uVar130 < 0x100) * (char)(uVar129 >> 8) - (0xff < uVar130);
      dst[0x2e] = (uVar132 != 0) * (uVar132 < 0x100) * (char)(uVar131 >> 8) - (0xff < uVar132);
      dst[0x2f] = (uVar104 != 0) * (uVar104 < 0x100) * (char)(uVar133 >> 8) - (0xff < uVar104);
      uVar70 = sVar69 * uVar102 + sVar107;
      uVar75 = sVar73 * auVar38._2_2_ + sVar110;
      uVar80 = sVar78 * auVar51._0_2_ + sVar111;
      uVar83 = sVar81 * sVar103 + sVar112;
      uVar86 = sVar84 * auVar33._8_2_ + sVar113;
      uVar89 = sVar87 * auVar23._10_2_ + sVar114;
      uVar92 = sVar90 * auVar13._12_2_ + sVar115;
      uVar95 = sVar93 * uVar77 + sVar116;
      uVar74 = uVar70 >> 8;
      uVar79 = uVar75 >> 8;
      uVar82 = uVar80 >> 8;
      uVar85 = uVar83 >> 8;
      uVar88 = uVar86 >> 8;
      uVar91 = uVar89 >> 8;
      uVar94 = uVar92 >> 8;
      uVar117 = uVar95 >> 8;
      uVar118 = sVar69 * (ushort)auVar4[8] + sVar107;
      uVar121 = sVar73 * (ushort)auVar4[9] + sVar110;
      uVar123 = sVar78 * (ushort)auVar4[10] + sVar111;
      uVar125 = sVar81 * (ushort)auVar4[0xb] + sVar112;
      uVar127 = sVar84 * (ushort)auVar4[0xc] + sVar113;
      uVar129 = sVar87 * (ushort)auVar4[0xd] + sVar114;
      uVar131 = sVar90 * (ushort)auVar4[0xe] + sVar115;
      uVar133 = sVar93 * (ushort)auVar4[0xf] + sVar116;
      uVar120 = uVar118 >> 8;
      uVar122 = uVar121 >> 8;
      uVar124 = uVar123 >> 8;
      uVar126 = uVar125 >> 8;
      uVar128 = uVar127 >> 8;
      uVar130 = uVar129 >> 8;
      uVar132 = uVar131 >> 8;
      uVar104 = uVar133 >> 8;
      dst[0x30] = (uVar74 != 0) * (uVar74 < 0x100) * (char)(uVar70 >> 8) - (0xff < uVar74);
      dst[0x31] = (uVar79 != 0) * (uVar79 < 0x100) * (char)(uVar75 >> 8) - (0xff < uVar79);
      dst[0x32] = (uVar82 != 0) * (uVar82 < 0x100) * (char)(uVar80 >> 8) - (0xff < uVar82);
      dst[0x33] = (uVar85 != 0) * (uVar85 < 0x100) * (char)(uVar83 >> 8) - (0xff < uVar85);
      dst[0x34] = (uVar88 != 0) * (uVar88 < 0x100) * (char)(uVar86 >> 8) - (0xff < uVar88);
      dst[0x35] = (uVar91 != 0) * (uVar91 < 0x100) * (char)(uVar89 >> 8) - (0xff < uVar91);
      dst[0x36] = (uVar94 != 0) * (uVar94 < 0x100) * (char)(uVar92 >> 8) - (0xff < uVar94);
      dst[0x37] = (uVar117 != 0) * (uVar117 < 0x100) * (char)(uVar95 >> 8) - (0xff < uVar117);
      dst[0x38] = (uVar120 != 0) * (uVar120 < 0x100) * (char)(uVar118 >> 8) - (0xff < uVar120);
      dst[0x39] = (uVar122 != 0) * (uVar122 < 0x100) * (char)(uVar121 >> 8) - (0xff < uVar122);
      dst[0x3a] = (uVar124 != 0) * (uVar124 < 0x100) * (char)(uVar123 >> 8) - (0xff < uVar124);
      dst[0x3b] = (uVar126 != 0) * (uVar126 < 0x100) * (char)(uVar125 >> 8) - (0xff < uVar126);
      dst[0x3c] = (uVar128 != 0) * (uVar128 < 0x100) * (char)(uVar127 >> 8) - (0xff < uVar128);
      dst[0x3d] = (uVar130 != 0) * (uVar130 < 0x100) * (char)(uVar129 >> 8) - (0xff < uVar130);
      dst[0x3e] = (uVar132 != 0) * (uVar132 < 0x100) * (char)(uVar131 >> 8) - (0xff < uVar132);
      dst[0x3f] = (uVar104 != 0) * (uVar104 < 0x100) * (char)(uVar133 >> 8) - (0xff < uVar104);
      dst = dst + stride;
    }
  }
  return;
}

Assistant:

void aom_smooth_v_predictor_64x64_ssse3(
    uint8_t *LIBAOM_RESTRICT dst, ptrdiff_t stride,
    const uint8_t *LIBAOM_RESTRICT top_row,
    const uint8_t *LIBAOM_RESTRICT left_column) {
  const __m128i zero = _mm_setzero_si128();
  const __m128i bottom_left = _mm_set1_epi16(left_column[63]);
  const __m128i top_lolo = LoadUnaligned16(top_row);
  const __m128i top_lohi = LoadUnaligned16(top_row + 16);
  const __m128i top1 = cvtepu8_epi16(top_lolo);
  const __m128i top2 = _mm_unpackhi_epi8(top_lolo, zero);
  const __m128i top3 = cvtepu8_epi16(top_lohi);
  const __m128i top4 = _mm_unpackhi_epi8(top_lohi, zero);
  const __m128i top_hilo = LoadUnaligned16(top_row + 32);
  const __m128i top_hihi = LoadUnaligned16(top_row + 48);
  const __m128i top5 = cvtepu8_epi16(top_hilo);
  const __m128i top6 = _mm_unpackhi_epi8(top_hilo, zero);
  const __m128i top7 = cvtepu8_epi16(top_hihi);
  const __m128i top8 = _mm_unpackhi_epi8(top_hihi, zero);
  const __m128i scale = _mm_set1_epi16(1 << SMOOTH_WEIGHT_LOG2_SCALE);
  const __m128i round = _mm_set1_epi16(128);
  const uint8_t *weights_base_ptr = smooth_weights + 60;
  for (int left_offset = 0; left_offset < 64; left_offset += 16) {
    const __m128i weights = LoadUnaligned16(weights_base_ptr + left_offset);
    const __m128i weights_lo = cvtepu8_epi16(weights);
    const __m128i weights_hi = _mm_unpackhi_epi8(weights, zero);
    const __m128i inverted_weights_lo = _mm_sub_epi16(scale, weights_lo);
    const __m128i inverted_weights_hi = _mm_sub_epi16(scale, weights_hi);
    const __m128i scaled_bottom_left_lo =
        _mm_mullo_epi16(inverted_weights_lo, bottom_left);
    const __m128i scaled_bottom_left_hi =
        _mm_mullo_epi16(inverted_weights_hi, bottom_left);
    for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
      const __m128i y_select = _mm_set1_epi32(y_mask);
      const __m128i weights_y = _mm_shuffle_epi8(weights_lo, y_select);
      const __m128i scaled_bottom_left_y =
          _mm_shuffle_epi8(scaled_bottom_left_lo, y_select);
      write_smooth_directional_sum16(dst, top1, top2, weights_y, weights_y,
                                     scaled_bottom_left_y, scaled_bottom_left_y,
                                     round);
      write_smooth_directional_sum16(dst + 16, top3, top4, weights_y, weights_y,
                                     scaled_bottom_left_y, scaled_bottom_left_y,
                                     round);
      write_smooth_directional_sum16(dst + 32, top5, top6, weights_y, weights_y,
                                     scaled_bottom_left_y, scaled_bottom_left_y,
                                     round);
      write_smooth_directional_sum16(dst + 48, top7, top8, weights_y, weights_y,
                                     scaled_bottom_left_y, scaled_bottom_left_y,
                                     round);
      dst += stride;
    }
    for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
      const __m128i y_select = _mm_set1_epi32(y_mask);
      const __m128i weights_y = _mm_shuffle_epi8(weights_hi, y_select);
      const __m128i scaled_bottom_left_y =
          _mm_shuffle_epi8(scaled_bottom_left_hi, y_select);
      write_smooth_directional_sum16(dst, top1, top2, weights_y, weights_y,
                                     scaled_bottom_left_y, scaled_bottom_left_y,
                                     round);
      write_smooth_directional_sum16(dst + 16, top3, top4, weights_y, weights_y,
                                     scaled_bottom_left_y, scaled_bottom_left_y,
                                     round);
      write_smooth_directional_sum16(dst + 32, top5, top6, weights_y, weights_y,
                                     scaled_bottom_left_y, scaled_bottom_left_y,
                                     round);
      write_smooth_directional_sum16(dst + 48, top7, top8, weights_y, weights_y,
                                     scaled_bottom_left_y, scaled_bottom_left_y,
                                     round);
      dst += stride;
    }
  }
}